

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v10::vprint(FILE *f,string_view fmt,format_args args)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  size_t count;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd48;
  buffer<char> *this_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  FILE *f_00;
  string_view in_stack_fffffffffffffd68;
  FILE local_249;
  buffer<char> local_248 [5];
  buffer<char> *in_stack_fffffffffffffe58;
  locale_ref in_stack_fffffffffffffe60;
  type in_stack_fffffffffffffe68;
  basic_string_view<char> in_stack_fffffffffffffe78;
  
  f_00 = &local_249;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  detail::vformat_to<char>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe78,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60);
  this_00 = local_248;
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
         detail::buffer<char>::data(this_00);
  count = detail::buffer<char>::size(this_00);
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&stack0xfffffffffffffd68,(char *)this,count);
  detail::print(f_00,in_stack_fffffffffffffd68);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  detail::print(f, {buffer.data(), buffer.size()});
}